

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

void __thiscall
restincurl::SystemException::SystemException(SystemException *this,string *msg,int e)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [36];
  int local_1c;
  string *psStack_18;
  int e_local;
  string *msg_local;
  SystemException *this_local;
  
  local_1c = e;
  psStack_18 = msg;
  msg_local = (string *)this;
  std::operator+(local_60,(char *)msg);
  strerror(local_1c);
  std::operator+(local_40,(char *)local_60);
  Exception::Exception(&this->super_Exception,local_40);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string((string *)local_60);
  *(undefined ***)&this->super_Exception = &PTR__SystemException_0019d5f0;
  this->err_ = local_1c;
  return;
}

Assistant:

SystemException(const std::string& msg, const int e) : Exception(msg + " " + strerror(e)), err_{e} {}